

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManRefinePrintPPis(Ga2_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  uint i;
  
  p_00 = Vec_IntAlloc(100);
  for (iVar6 = 0; iVar6 < p->vValues->nSize; iVar6 = iVar6 + 1) {
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vValues,iVar6);
    pGVar4 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar6 != 0) {
      iVar2 = Ga2_ObjIsAbs(p,pGVar4);
      if (iVar2 == 0) {
        if (-1 < *(long *)pGVar4) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d1,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        iVar2 = Ga2_ObjIsLeaf(p,pGVar4);
        if (iVar2 == 0) {
          __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d2,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        uVar5 = ~*(uint *)pGVar4;
        if (((uVar5 & 0x9fffffff) != 0) && ((int)*(uint *)pGVar4 < 0 || (uVar5 & 0x1fffffff) == 0))
        {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d3,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        iVar2 = Gia_ObjId(p->pGia,pGVar4);
        Vec_IntPush(p_00,iVar2);
      }
    }
  }
  uVar5 = p_00->nSize;
  printf("        Current PPIs (%d): ",(ulong)uVar5);
  qsort(p_00->pArray,(long)(int)uVar5,4,Vec_IntSortCompare2);
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  for (i = 0; uVar5 != i; i = i + 1) {
    pGVar1 = p->pGia;
    iVar6 = Vec_IntEntry(p_00,i);
    pGVar4 = Gia_ManObj(pGVar1,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ObjId(p->pGia,pGVar4);
    printf("%d ",(ulong)uVar3);
  }
  putchar(10);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Ga2_ManRefinePrintPPis( Ga2_Man_t * p )
{
    Vec_Int_t * vVec = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
    }
    printf( "        Current PPIs (%d): ", Vec_IntSize(vVec) );
    Vec_IntSort( vVec, 1 );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        printf( "%d ", Gia_ObjId(p->pGia, pObj) );
    printf( "\n" );
    Vec_IntFree( vVec );
}